

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_rescale(secp256k1_gej *r,secp256k1_fe *s)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ulong uVar47;
  ulong uVar48;
  long lVar49;
  long lVar50;
  uint uVar51;
  ulong uVar52;
  int *extraout_RDX;
  ulong uVar53;
  ulong uVar54;
  secp256k1_gej *r_00;
  secp256k1_fe *psVar55;
  ulong uVar56;
  ulong uVar57;
  long lVar58;
  bool bVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  secp256k1_fe zz;
  undefined1 auStack_160 [16];
  undefined1 auStack_150 [16];
  undefined1 auStack_140 [16];
  undefined1 auStack_130 [16];
  undefined1 auStack_120 [32];
  uint64_t uStack_100;
  undefined8 uStack_f8;
  undefined1 auStack_f0 [16];
  undefined1 auStack_e0 [16];
  uint64_t uStack_d0;
  undefined8 uStack_c8;
  int iStack_c0;
  undefined8 uStack_b8;
  secp256k1_fe *psStack_b0;
  secp256k1_fe local_60;
  
  secp256k1_gej_verify(r);
  secp256k1_fe_verify(s);
  secp256k1_fe_verify(s);
  uVar47 = (s->n[4] >> 0x30) * 0x1000003d1 + s->n[0];
  r_00 = (secp256k1_gej *)0xffffefffffc2f;
  if (((uVar47 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar47 & 0xfffffffffffff) == 0)) {
    uVar52 = (uVar47 >> 0x34) + s->n[1];
    r_00 = (secp256k1_gej *)((uVar52 >> 0x34) + s->n[2]);
    psVar55 = (secp256k1_fe *)(((ulong)r_00 >> 0x34) + s->n[3]);
    uVar56 = ((ulong)psVar55 >> 0x34) + (s->n[4] & 0xffffffffffff);
    if ((((uVar52 | uVar47 | (ulong)r_00 | (ulong)psVar55) & 0xfffffffffffff) == 0 && uVar56 == 0)
       || (((uVar47 | 0x1000003d0) & uVar52 & (ulong)r_00 & (ulong)psVar55 &
           (uVar56 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_00118496;
  }
  psVar55 = s;
  secp256k1_fe_verify(s);
  if (s->magnitude < 9) {
    uVar47 = s->n[0];
    uVar52 = s->n[1];
    uVar56 = s->n[2];
    uVar2 = s->n[3];
    uVar3 = s->n[4];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar47 * 2;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar52 * 2;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar56;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar3;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar3;
    uVar48 = SUB168(auVar6 * auVar26,0);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar48 & 0xfffffffffffff;
    auVar60 = auVar5 * auVar25 + auVar4 * auVar24 + auVar7 * ZEXT816(0x1000003d10);
    uVar53 = auVar60._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar53 >> 0x34 | auVar60._8_8_ << 0xc;
    uVar3 = uVar3 * 2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar47;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar3;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar52 * 2;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar2;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar56;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar56;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar48 >> 0x34 | SUB168(auVar6 * auVar26,8) << 0xc;
    auVar60 = auVar8 * auVar27 + auVar40 + auVar9 * auVar28 + auVar10 * auVar29 +
              auVar11 * ZEXT816(0x1000003d10);
    uVar48 = auVar60._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar48 >> 0x34 | auVar60._8_8_ << 0xc;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar47;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar47;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar52;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar3;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar56 * 2;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar2;
    auVar60 = auVar13 * auVar31 + auVar41 + auVar14 * auVar32;
    uVar54 = auVar60._0_8_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar54 >> 0x34 | auVar60._8_8_ << 0xc;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = (uVar54 & 0xfffffffffffff) << 4 | (uVar48 & 0xfffffffffffff) >> 0x30;
    auVar60 = auVar12 * auVar30 + ZEXT816(0x1000003d1) * auVar33;
    uVar54 = auVar60._0_8_;
    local_60.n[0] = uVar54 & 0xfffffffffffff;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar54 >> 0x34 | auVar60._8_8_ << 0xc;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar47 * 2;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar52;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar56;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar3;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar2;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar2;
    auVar61 = auVar16 * auVar35 + auVar43 + auVar17 * auVar36;
    uVar54 = auVar61._0_8_;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar54 & 0xfffffffffffff;
    auVar60 = auVar15 * auVar34 + auVar42 + auVar18 * ZEXT816(0x1000003d10);
    uVar57 = auVar60._0_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar54 >> 0x34 | auVar61._8_8_ << 0xc;
    local_60.n[1] = uVar57 & 0xfffffffffffff;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar57 >> 0x34 | auVar60._8_8_ << 0xc;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar47 * 2;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar56;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar52;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar52;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar2;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar3;
    auVar45 = auVar21 * auVar39 + auVar45;
    uVar47 = auVar45._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar47 & 0xfffffffffffff;
    auVar60 = auVar19 * auVar37 + auVar44 + auVar20 * auVar38 + auVar22 * ZEXT816(0x1000003d10);
    uVar52 = auVar60._0_8_;
    local_60.n[2] = uVar52 & 0xfffffffffffff;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = (uVar52 >> 0x34 | auVar60._8_8_ << 0xc) + (uVar53 & 0xfffffffffffff);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar47 >> 0x34 | auVar45._8_8_ << 0xc;
    auVar46 = auVar23 * ZEXT816(0x1000003d10) + auVar46;
    uVar47 = auVar46._0_8_;
    local_60.n[3] = uVar47 & 0xfffffffffffff;
    local_60.n[4] = (uVar47 >> 0x34 | auVar46._8_8_ << 0xc) + (uVar48 & 0xffffffffffff);
    local_60.magnitude = 1;
    local_60.normalized = 0;
    secp256k1_fe_verify(&local_60);
    secp256k1_fe_mul(&r->x,&r->x,&local_60);
    psVar55 = &r->y;
    secp256k1_fe_mul(psVar55,psVar55,&local_60);
    secp256k1_fe_mul(psVar55,psVar55,s);
    secp256k1_fe_mul(&r->z,&r->z,s);
    secp256k1_gej_verify(r);
    return;
  }
  secp256k1_gej_rescale_cold_2();
LAB_00118496:
  secp256k1_gej_rescale_cold_1();
  uStack_b8 = 0xfffffffffffff;
  auStack_130 = (undefined1  [16])0x0;
  auStack_140 = (undefined1  [16])0x0;
  auStack_150 = (undefined1  [16])0x0;
  auStack_160 = (undefined1  [16])0x0;
  psStack_b0 = s;
  memcpy(r_00,psVar55->n + 1,0x98);
  uVar51 = *(int *)((long)psVar55->n + 4) + *extraout_RDX;
  iStack_c0 = 0;
  lVar58 = 0x133110;
  uVar47 = 0;
  do {
    uVar52 = (ulong)(uVar51 - (uVar51 / 0xd + (uVar51 / 0xd) * 0xc) >>
                    ((char)uVar47 * '\x04' & 0x1fU));
    if (7 < uVar47) {
      uVar52 = 0;
    }
    lVar50 = 0;
    do {
      bVar59 = uVar52 * 0x40 == lVar50;
      lVar49 = (long)(int)(uint)bVar59;
      lVar1 = lVar49 + -1;
      lVar49 = -lVar49;
      auVar60._8_4_ = (int)lVar1;
      auVar60._0_8_ = lVar1;
      auVar60._12_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar62._8_4_ = (int)lVar49;
      auVar62._0_8_ = lVar49;
      auVar62._12_4_ = (int)((ulong)lVar49 >> 0x20);
      auStack_160 = *(undefined1 (*) [16])(lVar58 + -0x30 + lVar50) & auVar62 |
                    auStack_160 & auVar60;
      auStack_150 = auVar62 & *(undefined1 (*) [16])(lVar58 + -0x20 + lVar50) |
                    auVar60 & auStack_150;
      lVar49 = (long)(int)(uint)bVar59;
      lVar1 = lVar49 + -1;
      lVar49 = -lVar49;
      auVar61._8_4_ = (int)lVar1;
      auVar61._0_8_ = lVar1;
      auVar61._12_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar63._8_4_ = (int)lVar49;
      auVar63._0_8_ = lVar49;
      auVar63._12_4_ = (int)((ulong)lVar49 >> 0x20);
      auStack_140 = *(undefined1 (*) [16])(lVar58 + -0x10 + lVar50) & auVar63 |
                    auStack_140 & auVar61;
      auStack_130 = auVar63 & *(undefined1 (*) [16])(lVar58 + lVar50) | auVar61 & auStack_130;
      lVar50 = lVar50 + 0x40;
    } while (lVar50 != 0x400);
    secp256k1_ge_from_storage((secp256k1_ge *)auStack_120,(secp256k1_ge_storage *)auStack_160);
    secp256k1_gej_add_ge(r_00,r_00,(secp256k1_ge *)auStack_120);
    uVar47 = uVar47 + 1;
    lVar58 = lVar58 + 0x400;
  } while (uVar47 != 0x40);
  iStack_c0 = 0;
  uStack_f8._0_4_ = 0;
  uStack_f8._4_4_ = 1;
  auStack_120._0_16_ = (undefined1  [16])0x0;
  auStack_120._16_16_ = (undefined1  [16])0x0;
  uStack_100 = 0;
  secp256k1_fe_verify((secp256k1_fe *)auStack_120);
  uStack_c8._0_4_ = 0;
  uStack_c8._4_4_ = 1;
  auStack_f0 = (undefined1  [16])0x0;
  auStack_e0 = (undefined1  [16])0x0;
  uStack_d0 = 0;
  secp256k1_fe_verify((secp256k1_fe *)auStack_f0);
  return;
}

Assistant:

static void secp256k1_gej_rescale(secp256k1_gej *r, const secp256k1_fe *s) {
    /* Operations: 4 mul, 1 sqr */
    secp256k1_fe zz;
    secp256k1_gej_verify(r);
    secp256k1_fe_verify(s);
#ifdef VERIFY
    VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(s));
#endif
    secp256k1_fe_sqr(&zz, s);
    secp256k1_fe_mul(&r->x, &r->x, &zz);                /* r->x *= s^2 */
    secp256k1_fe_mul(&r->y, &r->y, &zz);
    secp256k1_fe_mul(&r->y, &r->y, s);                  /* r->y *= s^3 */
    secp256k1_fe_mul(&r->z, &r->z, s);                  /* r->z *= s   */
    secp256k1_gej_verify(r);
}